

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<const_notch::core::ABackpropLayer> __thiscall
notch::core::Net::getLayer(Net *this,size_t i)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_notch::core::ABackpropLayer> sVar3;
  shared_ptr<notch::core::ABackpropLayer> local_30;
  size_type local_20;
  size_t i_local;
  Net *this_local;
  
  local_20 = in_RDX;
  i_local = i;
  this_local = this;
  sVar1 = std::
          vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
          ::size((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                  *)(i + 8));
  if (in_RDX < sVar1) {
    pvVar2 = std::
             vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             ::operator[]((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                           *)(i + 8),local_20);
    std::shared_ptr<notch::core::ABackpropLayer>::shared_ptr(&local_30,pvVar2);
  }
  else {
    std::shared_ptr<notch::core::ABackpropLayer>::shared_ptr(&local_30,(nullptr_t)0x0);
  }
  ::std::shared_ptr<notch::core::ABackpropLayer_const>::shared_ptr<notch::core::ABackpropLayer,void>
            ((shared_ptr<notch::core::ABackpropLayer_const> *)this,&local_30);
  std::shared_ptr<notch::core::ABackpropLayer>::~shared_ptr(&local_30);
  sVar3.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_notch::core::ABackpropLayer>)
         sVar3.super___shared_ptr<const_notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ABackpropLayer> getLayer(size_t i) const {
       return (i < layers.size()) ? layers[i] : nullptr;
    }